

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gears.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 in_RAX;
  GLFWwindow *handle;
  GLFWwindow *window;
  double dVar2;
  GLfloat in_XMM3_Da;
  int height;
  int width;
  undefined8 local_38;
  
  local_38 = in_RAX;
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    fwrite("Failed to initialize GLFW\n",0x1a,1,_stderr);
  }
  else {
    glfwWindowHint(0x21005,0x10);
    glfwWindowHint(0x2000a,1);
    handle = glfwCreateWindow(300,300,"Gears",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle != (GLFWwindow *)0x0) {
      glfwSetFramebufferSizeCallback(handle,reshape);
      glfwSetKeyCallback(handle,key);
      glfwMakeContextCurrent(handle);
      gladLoadGLLoader(glfwGetProcAddress);
      glfwSwapInterval(1);
      window = handle;
      glfwGetFramebufferSize(handle,(int *)((long)&local_38 + 4),(int *)&local_38);
      reshape(window,local_38._4_4_,(int)local_38);
      (*glad_glLightfv)(0x4000,0x1203,(GLfloat *)init_pos);
      (*glad_glEnable)(0xb44);
      (*glad_glEnable)(0xb50);
      (*glad_glEnable)(0x4000);
      (*glad_glEnable)(0xb71);
      gear1 = (*glad_glGenLists)(1);
      (*glad_glNewList)(gear1,0x1300);
      (*glad_glMaterialfv)(0x404,0x1602,(GLfloat *)init_red);
      gear(1.0,4.0,1.0,0x14,in_XMM3_Da);
      (*glad_glEndList)();
      gear2 = (*glad_glGenLists)(1);
      (*glad_glNewList)(gear2,0x1300);
      (*glad_glMaterialfv)(0x404,0x1602,(GLfloat *)init_green);
      gear(0.5,2.0,2.0,10,in_XMM3_Da);
      (*glad_glEndList)();
      gear3 = (*glad_glGenLists)(1);
      (*glad_glNewList)(gear3,0x1300);
      (*glad_glMaterialfv)(0x404,0x1602,(GLfloat *)init_blue);
      gear(1.3,2.0,0.5,10,in_XMM3_Da);
      (*glad_glEndList)();
      (*glad_glEnable)(0xba1);
      iVar1 = glfwWindowShouldClose(handle);
      while (iVar1 == 0) {
        (*glad_glClearColor)(0.0,0.0,0.0,0.0);
        (*glad_glClear)(0x4100);
        (*glad_glPushMatrix)();
        (*glad_glRotatef)(view_rotx,1.0,0.0,0.0);
        (*glad_glRotatef)(view_roty,0.0,1.0,0.0);
        (*glad_glRotatef)(view_rotz,0.0,0.0,1.0);
        (*glad_glPushMatrix)();
        (*glad_glTranslatef)(-3.0,-2.0,0.0);
        (*glad_glRotatef)(angle,0.0,0.0,1.0);
        (*glad_glCallList)(gear1);
        (*glad_glPopMatrix)();
        (*glad_glPushMatrix)();
        (*glad_glTranslatef)(3.1,-2.0,0.0);
        (*glad_glRotatef)(-9.0 - (angle + angle),0.0,0.0,1.0);
        (*glad_glCallList)(gear2);
        (*glad_glPopMatrix)();
        (*glad_glPushMatrix)();
        (*glad_glTranslatef)(-3.1,4.2,0.0);
        (*glad_glRotatef)(-25.0 - (angle + angle),0.0,0.0,1.0);
        (*glad_glCallList)(gear3);
        (*glad_glPopMatrix)();
        (*glad_glPopMatrix)();
        dVar2 = glfwGetTime();
        angle = (float)dVar2 * 100.0;
        glfwSwapBuffers(handle);
        glfwPollEvents();
        iVar1 = glfwWindowShouldClose(handle);
      }
      glfwTerminate();
      exit(0);
    }
    fwrite("Failed to open GLFW window\n",0x1b,1,_stderr);
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(int argc, char *argv[])
{
    GLFWwindow* window;
    int width, height;

    if( !glfwInit() )
    {
        fprintf( stderr, "Failed to initialize GLFW\n" );
        exit( EXIT_FAILURE );
    }

    glfwWindowHint(GLFW_DEPTH_BITS, 16);
    glfwWindowHint(GLFW_TRANSPARENT_FRAMEBUFFER, GLFW_TRUE);

    window = glfwCreateWindow( 300, 300, "Gears", NULL, NULL );
    if (!window)
    {
        fprintf( stderr, "Failed to open GLFW window\n" );
        glfwTerminate();
        exit( EXIT_FAILURE );
    }

    // Set callback functions
    glfwSetFramebufferSizeCallback(window, reshape);
    glfwSetKeyCallback(window, key);

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    glfwSwapInterval( 1 );

    glfwGetFramebufferSize(window, &width, &height);
    reshape(window, width, height);

    // Parse command-line options
    init();

    // Main loop
    while( !glfwWindowShouldClose(window) )
    {
        // Draw gears
        draw();

        // Update animation
        animate();

        // Swap buffers
        glfwSwapBuffers(window);
        glfwPollEvents();
    }

    // Terminate GLFW
    glfwTerminate();

    // Exit program
    exit( EXIT_SUCCESS );
}